

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

DescriptorKeyReference * __thiscall
cfd::core::DescriptorNode::GetKeyReferences
          (DescriptorKeyReference *__return_storage_ptr__,DescriptorNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *array_argument)

{
  bool bVar1;
  uint32_t child_num;
  reference pvVar2;
  ulong uVar3;
  long lVar4;
  CfdException *pCVar5;
  __type local_1c79;
  allocator local_1c09;
  string local_1c08;
  CfdSourceLocation local_1be8;
  CfdException *except_2;
  KeyData local_1938;
  Pubkey local_17e8;
  undefined1 local_17ca;
  allocator local_17c9;
  string local_17c8;
  CfdSourceLocation local_17a8;
  DescriptorKeyReference local_1790;
  ExtPubkey local_1500;
  ExtPubkey local_1490;
  DescriptorKeyReference local_1420;
  ExtPubkey local_1190;
  ExtPrivkey local_1120;
  undefined1 local_10a8 [8];
  ExtPrivkey xpriv;
  undefined1 local_1018 [8];
  ByteData256 tweak_sum;
  ExtPubkey xpub;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f88;
  undefined1 local_f62;
  allocator local_f61;
  string local_f60;
  CfdSourceLocation local_f40;
  byte local_f25;
  uint32_t local_f24;
  bool has_base;
  string *psStack_f20;
  uint32_t need_arg_num;
  string *arg_pointer;
  string arg_value;
  CfdException *except_1;
  KeyData local_c48;
  DescriptorKeyReference local_af8;
  undefined1 local_868 [8];
  SchnorrPubkey schnorr_pubkey;
  CfdException *except;
  KeyData local_5b8;
  DescriptorKeyReference local_468;
  Pubkey local_1d8;
  undefined1 local_1c0 [8];
  KeyData key_data;
  string using_key;
  undefined1 local_40 [8];
  Pubkey pubkey;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *array_argument_local;
  DescriptorNode *this_local;
  DescriptorKeyReference *result;
  
  pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  DescriptorKeyReference::DescriptorKeyReference(__return_storage_ptr__);
  Pubkey::Pubkey((Pubkey *)local_40);
  ::std::__cxx11::string::string
            ((string *)
             &key_data.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(string *)&this->key_info_);
  KeyData::KeyData((KeyData *)local_1c0);
  if (this->key_type_ == kDescriptorKeyPublic) {
    Pubkey::Pubkey(&local_1d8,&this->key_info_);
    Pubkey::operator=((Pubkey *)local_40,&local_1d8);
    Pubkey::~Pubkey(&local_1d8);
    DescriptorKeyReference::DescriptorKeyReference(&local_468,(Pubkey *)local_40);
    DescriptorKeyReference::operator=(__return_storage_ptr__,&local_468);
    DescriptorKeyReference::~DescriptorKeyReference(&local_468);
    KeyData::KeyData(&local_5b8,&this->value_,-1,false);
    KeyData::operator=((KeyData *)local_1c0,&local_5b8);
    KeyData::~KeyData(&local_5b8);
    DescriptorKeyReference::DescriptorKeyReference
              ((DescriptorKeyReference *)&except,(KeyData *)local_1c0,(string *)0x0);
    DescriptorKeyReference::operator=(__return_storage_ptr__,(DescriptorKeyReference *)&except);
    DescriptorKeyReference::~DescriptorKeyReference((DescriptorKeyReference *)&except);
  }
  else if (this->key_type_ == kDescriptorKeySchnorr) {
    SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)local_868,&this->key_info_);
    DescriptorKeyReference::DescriptorKeyReference(&local_af8,(SchnorrPubkey *)local_868);
    DescriptorKeyReference::operator=(__return_storage_ptr__,&local_af8);
    DescriptorKeyReference::~DescriptorKeyReference(&local_af8);
    KeyData::KeyData(&local_c48,&this->value_,-1,true);
    KeyData::operator=((KeyData *)local_1c0,&local_c48);
    KeyData::~KeyData(&local_c48);
    DescriptorKeyReference::DescriptorKeyReference
              ((DescriptorKeyReference *)&except_1,(KeyData *)local_1c0,(string *)0x0);
    DescriptorKeyReference::operator=(__return_storage_ptr__,(DescriptorKeyReference *)&except_1);
    DescriptorKeyReference::~DescriptorKeyReference((DescriptorKeyReference *)&except_1);
    SchnorrPubkey::CreatePubkey
              ((Pubkey *)((long)&arg_value.field_2 + 8),(SchnorrPubkey *)local_868,false);
    Pubkey::operator=((Pubkey *)local_40,(Pubkey *)((long)&arg_value.field_2 + 8));
    Pubkey::~Pubkey((Pubkey *)((long)&arg_value.field_2 + 8));
    SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)local_868);
  }
  else if ((this->key_type_ == kDescriptorKeyBip32) || (this->key_type_ == kDescriptorKeyBip32Priv))
  {
    ::std::__cxx11::string::string((string *)&arg_pointer);
    psStack_f20 = (string *)0x0;
    local_f24 = this->need_arg_num_;
    local_f25 = 0;
    if (local_f24 != 0) {
      if ((array_argument ==
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x0) ||
         (bVar1 = ::std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::empty(array_argument), bVar1)) {
        local_f40.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_descriptor.cpp"
                     ,0x2f);
        local_f40.filename = local_f40.filename + 1;
        local_f40.line = 0x765;
        local_f40.funcname = "GetKeyReferences";
        logger::warn<>(&local_f40,"Failed to generate pubkey from hdkey.");
        local_f62 = 1;
        pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_f60,"Failed to generate pubkey from hdkey.",&local_f61);
        CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,&local_f60);
        local_f62 = 0;
        __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
      }
      xpub.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
      xpub.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
      local_1c79 = false;
      if (array_argument !=
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x0) {
        bVar1 = ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(array_argument);
        local_1c79 = false;
        if (!bVar1) {
          pvVar2 = ::std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::at(array_argument,0);
          ::std::allocator<char>::allocator();
          xpub.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
          ::std::__cxx11::string::string
                    ((string *)&local_f88,"base",
                     (allocator *)
                     ((long)&xpub.tweak_sum_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          xpub.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 1;
          local_1c79 = ::std::operator==(pvVar2,&local_f88);
        }
      }
      if ((xpub.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ & 1) != 0) {
        ::std::__cxx11::string::~string((string *)&local_f88);
      }
      if ((xpub.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1) != 0) {
        ::std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&xpub.tweak_sum_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage + 7));
      }
      if (local_1c79 == false) {
        ::std::__cxx11::string::operator=((string *)&arg_pointer,"0");
        if (array_argument !=
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x0) {
          pvVar2 = ::std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::back(array_argument);
          ::std::__cxx11::string::operator=((string *)&arg_pointer,(string *)pvVar2);
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_back(array_argument);
        }
        psStack_f20 = (string *)&arg_pointer;
      }
      else {
        ::std::__cxx11::string::operator=
                  ((string *)
                   &key_data.fingerprint_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(string *)&this->base_extkey_);
        local_f24 = 0;
        local_f25 = 1;
      }
    }
    ExtPubkey::ExtPubkey
              ((ExtPubkey *)
               &tweak_sum.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    ByteData256::ByteData256((ByteData256 *)local_1018);
    uVar3 = ::std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      ByteData256::ByteData256
                ((ByteData256 *)
                 &xpriv.tweak_sum_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&this->tweak_sum_);
      ByteData256::operator=
                ((ByteData256 *)local_1018,
                 (ByteData256 *)
                 &xpriv.tweak_sum_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      ByteData256::~ByteData256
                ((ByteData256 *)
                 &xpriv.tweak_sum_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    if (this->key_type_ == kDescriptorKeyBip32Priv) {
      ExtPrivkey::ExtPrivkey
                ((ExtPrivkey *)local_10a8,
                 (string *)
                 &key_data.fingerprint_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(ByteData256 *)local_1018);
      if (local_f24 != 0) {
        ExtPrivkey::DerivePrivkey(&local_1120,(ExtPrivkey *)local_10a8,(string *)&arg_pointer);
        ExtPrivkey::operator=((ExtPrivkey *)local_10a8,&local_1120);
        ExtPrivkey::~ExtPrivkey(&local_1120);
      }
      ExtPrivkey::GetExtPubkey(&local_1190,(ExtPrivkey *)local_10a8);
      ExtPubkey::operator=
                ((ExtPubkey *)
                 &tweak_sum.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&local_1190);
      ExtPubkey::~ExtPubkey(&local_1190);
      DescriptorKeyReference::DescriptorKeyReference
                (&local_1420,(ExtPrivkey *)local_10a8,psStack_f20);
      DescriptorKeyReference::operator=(__return_storage_ptr__,&local_1420);
      DescriptorKeyReference::~DescriptorKeyReference(&local_1420);
      ExtPrivkey::~ExtPrivkey((ExtPrivkey *)local_10a8);
    }
    else {
      ExtPubkey::ExtPubkey
                (&local_1490,
                 (string *)
                 &key_data.fingerprint_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(ByteData256 *)local_1018);
      ExtPubkey::operator=
                ((ExtPubkey *)
                 &tweak_sum.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&local_1490);
      ExtPubkey::~ExtPubkey(&local_1490);
      if (local_f24 != 0) {
        ExtPubkey::DerivePubkey
                  (&local_1500,
                   (ExtPubkey *)
                   &tweak_sum.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(string *)&arg_pointer);
        ExtPubkey::operator=
                  ((ExtPubkey *)
                   &tweak_sum.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,&local_1500);
        ExtPubkey::~ExtPubkey(&local_1500);
      }
      DescriptorKeyReference::DescriptorKeyReference
                (&local_1790,
                 (ExtPubkey *)
                 &tweak_sum.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,psStack_f20);
      DescriptorKeyReference::operator=(__return_storage_ptr__,&local_1790);
      DescriptorKeyReference::~DescriptorKeyReference(&local_1790);
    }
    bVar1 = ExtPubkey::IsValid((ExtPubkey *)
                               &tweak_sum.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) {
      local_17a8.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_descriptor.cpp"
                   ,0x2f);
      local_17a8.filename = local_17a8.filename + 1;
      local_17a8.line = 0x78e;
      local_17a8.funcname = "GetKeyReferences";
      logger::warn<>(&local_17a8,"Failed to generate pubkey from hdkey.");
      local_17ca = 1;
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_17c8,"Failed to generate pubkey from hdkey.",&local_17c9);
      CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,&local_17c8);
      local_17ca = 0;
      __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ExtPubkey::GetPubkey
              (&local_17e8,
               (ExtPubkey *)
               &tweak_sum.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    Pubkey::operator=((Pubkey *)local_40,&local_17e8);
    Pubkey::~Pubkey(&local_17e8);
    if (((local_f24 == 0) && ((local_f25 & 1) == 0)) ||
       ((uVar3 = ::std::__cxx11::string::empty(), (uVar3 & 1) == 0 &&
        (lVar4 = ::std::__cxx11::string::find((char)&arg_pointer,0x2f), lVar4 == -1)))) {
      child_num = ExtPubkey::GetChildNum
                            ((ExtPubkey *)
                             &tweak_sum.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
      KeyData::KeyData(&local_1938,&this->value_,child_num,false);
      KeyData::operator=((KeyData *)local_1c0,&local_1938);
      KeyData::~KeyData(&local_1938);
      DescriptorKeyReference::DescriptorKeyReference
                ((DescriptorKeyReference *)&except_2,(KeyData *)local_1c0,psStack_f20);
      DescriptorKeyReference::operator=(__return_storage_ptr__,(DescriptorKeyReference *)&except_2);
      DescriptorKeyReference::~DescriptorKeyReference((DescriptorKeyReference *)&except_2);
    }
    ByteData256::~ByteData256((ByteData256 *)local_1018);
    ExtPubkey::~ExtPubkey
              ((ExtPubkey *)
               &tweak_sum.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    ::std::__cxx11::string::~string((string *)&arg_pointer);
  }
  bVar1 = Pubkey::IsValid((Pubkey *)local_40);
  if (bVar1) {
    pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
    KeyData::~KeyData((KeyData *)local_1c0);
    ::std::__cxx11::string::~string
              ((string *)
               &key_data.fingerprint_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    Pubkey::~Pubkey((Pubkey *)local_40);
    if ((pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
      DescriptorKeyReference::~DescriptorKeyReference(__return_storage_ptr__);
    }
    return __return_storage_ptr__;
  }
  local_1be8.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_descriptor.cpp"
               ,0x2f);
  local_1be8.filename = local_1be8.filename + 1;
  local_1be8.line = 0x7a3;
  local_1be8.funcname = "GetKeyReferences";
  logger::
  warn<cfd::core::DescriptorNodeType_const&,cfd::core::DescriptorKeyType_const&,std::__cxx11::string&>
            (&local_1be8,"Failed to pubkey. type={}-{}, key_info={}",&this->node_type_,
             &this->key_type_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &key_data.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_1c08,"Invalid pubkey data.",&local_1c09);
  CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,&local_1c08);
  __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

DescriptorKeyReference DescriptorNode::GetKeyReferences(
    std::vector<std::string>* array_argument) const {
  DescriptorKeyReference result;
  Pubkey pubkey;
  std::string using_key = key_info_;
  KeyData key_data;
  if (key_type_ == DescriptorKeyType::kDescriptorKeyPublic) {
    pubkey = Pubkey(key_info_);
    result = DescriptorKeyReference(pubkey);
    try {
      key_data = KeyData(value_);
      result = DescriptorKeyReference(key_data);
    } catch (const CfdException& except) {
      if (value_[0] == '[') throw except;
    }
  } else if (key_type_ == DescriptorKeyType::kDescriptorKeySchnorr) {
    SchnorrPubkey schnorr_pubkey = SchnorrPubkey(key_info_);
    result = DescriptorKeyReference(schnorr_pubkey);
    try {
      key_data = KeyData(value_, -1, true);
      result = DescriptorKeyReference(key_data);
    } catch (const CfdException& except) {
      if (value_[0] == '[') throw except;
    }
    pubkey = schnorr_pubkey.CreatePubkey();
  } else if (
      (key_type_ == DescriptorKeyType::kDescriptorKeyBip32) ||
      (key_type_ == DescriptorKeyType::kDescriptorKeyBip32Priv)) {
    std::string arg_value;
    std::string* arg_pointer = nullptr;
    uint32_t need_arg_num = need_arg_num_;
    bool has_base = false;
    if (need_arg_num == 0) {
      // Fixed key. For strengthened keys, xprv/tprv is required.
    } else if ((array_argument == nullptr) || array_argument->empty()) {
      warn(CFD_LOG_SOURCE, "Failed to generate pubkey from hdkey.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to generate pubkey from hdkey.");
    } else if (
        (array_argument != nullptr) && (!array_argument->empty()) &&
        (array_argument->at(0) == std::string(kArgumentBaseExtkey))) {
      using_key = base_extkey_;
      need_arg_num = 0;
      has_base = true;
    } else {
      // Dynamic key generation. For strengthened keys, xprv/tprv is required.
      // If array_argument is nullptr, set it to 0 temporarily.
      // (For generate test)
      arg_value = "0";
      if (array_argument != nullptr) {
        arg_value = array_argument->back();
        array_argument->pop_back();
      }
      arg_pointer = &arg_value;
    }

    ExtPubkey xpub;
    ByteData256 tweak_sum;
    if (!tweak_sum_.empty()) tweak_sum = ByteData256(tweak_sum_);
    if (key_type_ == DescriptorKeyType::kDescriptorKeyBip32Priv) {
      ExtPrivkey xpriv(using_key, tweak_sum);
      if (need_arg_num != 0) {
        xpriv = xpriv.DerivePrivkey(arg_value);
      }
      xpub = xpriv.GetExtPubkey();
      result = DescriptorKeyReference(xpriv, arg_pointer);
    } else {
      xpub = ExtPubkey(using_key, tweak_sum);
      if (need_arg_num != 0) {
        xpub = xpub.DerivePubkey(arg_value);
      }
      result = DescriptorKeyReference(xpub, arg_pointer);
    }

    if (!xpub.IsValid()) {
      warn(CFD_LOG_SOURCE, "Failed to generate pubkey from hdkey.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to generate pubkey from hdkey.");
    }
    pubkey = xpub.GetPubkey();

    try {
      if (((need_arg_num == 0) && (!has_base)) ||
          ((!arg_value.empty()) &&
           (arg_value.find('/') == std::string::npos))) {
        key_data = KeyData(value_, static_cast<int32_t>(xpub.GetChildNum()));
        result = DescriptorKeyReference(key_data, arg_pointer);
      }
    } catch (const CfdException& except) {
      if (value_[0] == '[') throw except;
    }
  }

  if (!pubkey.IsValid()) {
    warn(
        CFD_LOG_SOURCE, "Failed to pubkey. type={}-{}, key_info={}",
        node_type_, key_type_, using_key);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid pubkey data.");
  }
  return result;
}